

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

void __thiscall uS::Socket::changePoll(Socket *this,SocketData *socketData)

{
  pointer *pppuVar1;
  NodeData *pNVar2;
  pthread_t pVar3;
  iterator __position;
  int iVar4;
  pthread_t pVar5;
  
  pNVar2 = socketData->nodeData;
  pVar3 = pNVar2->tid;
  pVar5 = pthread_self();
  if (pVar3 == pVar5) {
    uv_poll_start(this->p,socketData->poll,this->p->poll_cb);
    return;
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)pNVar2->asyncMutex);
  if (iVar4 == 0) {
    pNVar2 = socketData->nodeData;
    __position._M_current =
         (pNVar2->changePollQueue).super__Vector_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pNVar2->changePollQueue).super__Vector_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<uv_poll_s*,std::allocator<uv_poll_s*>>::_M_realloc_insert<uv_poll_s*const&>
                ((vector<uv_poll_s*,std::allocator<uv_poll_s*>> *)&pNVar2->changePollQueue,
                 __position,&this->p);
    }
    else {
      *__position._M_current = this->p;
      pppuVar1 = &(pNVar2->changePollQueue).
                  super__Vector_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppuVar1 = *pppuVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)socketData->nodeData->asyncMutex);
    uv_async_send(socketData->nodeData->async);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void changePoll(SocketData *socketData) {
        if (socketData->nodeData->tid != pthread_self()) {
            socketData->nodeData->asyncMutex->lock();
            socketData->nodeData->changePollQueue.push_back(p);
            socketData->nodeData->asyncMutex->unlock();
            uv_async_send(socketData->nodeData->async);
        } else {
            uv_poll_start(p, socketData->poll, getPollCallback());
        }
    }